

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  archive_string *paVar1;
  size_t sVar2;
  int64_t iVar3;
  unsigned_long uVar4;
  time_t tVar5;
  dev_t dVar6;
  mode_t mVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  la_int64_t lVar11;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar12;
  char *pcVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar14;
  char *extraout_RDX_02;
  char *fn;
  char *extraout_RDX_03;
  char *pcVar15;
  char *pcVar16;
  mtree_entry_conflict *self;
  mtree_entry_conflict *me;
  undefined8 *puVar17;
  ulong uVar18;
  char name [256];
  mtree_entry_conflict *local_170;
  archive_string local_168;
  undefined8 *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar17 = (undefined8 *)a->format_data;
  if (*(int *)(puVar17 + 0xe) != 0) {
    *(undefined4 *)(puVar17 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar17 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar17 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar17 + 300) = 0;
    }
  }
  lVar11 = archive_entry_size(entry);
  puVar17[0xf] = lVar11;
  if ((*(int *)((long)puVar17 + 0x124) != 0) &&
     (mVar7 = archive_entry_filetype(entry), mVar7 != 0x4000)) {
    return 0;
  }
  iVar8 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (iVar8 < -0x14) {
    return iVar8;
  }
  pcVar13 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length == 1) && (*(local_170->basename).s == '.')) {
      local_170->parent = local_170;
      pmVar12 = *(mtree_entry_conflict **)(pcVar13 + 8);
      if (pmVar12 != (mtree_entry_conflict *)0x0) goto LAB_004b01eb;
      *(mtree_entry_conflict **)(pcVar13 + 8) = local_170;
      local_170->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar13 + 0x38) = local_170;
      *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &local_170->next;
      goto LAB_004b034f;
    }
    pcVar13 = (local_170->pathname).s;
    pcVar15 = "Internal programing error in generating canonical name for %s";
LAB_004b020d:
    archive_set_error(&a->archive,-1,pcVar15,pcVar13);
LAB_004b021c:
    iVar8 = -0x19;
LAB_004b0221:
    mtree_entry_free(local_170);
  }
  else {
    pcVar15 = (local_170->parentdir).s;
    paVar1 = (archive_string *)(pcVar13 + 0x18);
    pcVar16 = extraout_RDX;
    if ((*(size_t *)(pcVar13 + 0x20) == sVar2) &&
       (iVar9 = strcmp(paVar1->s,pcVar15), pcVar16 = extraout_RDX_00, iVar9 == 0)) {
      iVar9 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(pcVar13 + 0x10) + 0x28),&me->rbnode);
      if (iVar9 == 0) {
        pmVar12 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node
                            (&(*(mtree_entry_conflict **)(pcVar13 + 0x10))->dir_info->rbtree,
                             (me->basename).s);
LAB_004b01eb:
        if (((me->mode ^ pmVar12->mode) & 0xf000) != 0) {
          pcVar13 = (pmVar12->pathname).s;
          pcVar15 = "Found duplicate entries `%s\' and its file type is different";
          goto LAB_004b020d;
        }
        (pmVar12->symlink).length = 0;
        archive_string_concat(&pmVar12->symlink,&me->symlink);
        (pmVar12->uname).length = 0;
        archive_string_concat(&pmVar12->uname,&me->uname);
        (pmVar12->gname).length = 0;
        archive_string_concat(&pmVar12->gname,&me->gname);
        (pmVar12->fflags_text).length = 0;
        archive_string_concat(&pmVar12->fflags_text,&me->fflags_text);
        mVar7 = me->filetype;
        pmVar12->nlink = me->nlink;
        pmVar12->filetype = mVar7;
        pmVar12->mode = me->mode;
        iVar3 = me->uid;
        pmVar12->size = me->size;
        pmVar12->uid = iVar3;
        uVar4 = me->fflags_clear;
        pmVar12->fflags_set = me->fflags_set;
        pmVar12->fflags_clear = uVar4;
        tVar5 = me->mtime;
        pmVar12->gid = me->gid;
        pmVar12->mtime = tVar5;
        pmVar12->mtime_nsec = me->mtime_nsec;
        dVar6 = me->rdevminor;
        pmVar12->rdevmajor = me->rdevmajor;
        pmVar12->rdevminor = dVar6;
        dVar6 = me->devminor;
        pmVar12->devmajor = me->devmajor;
        pmVar12->devminor = dVar6;
        pmVar12->ino = me->ino;
        if (pmVar12->dir_info != (dir_info *)0x0) {
          pmVar12->dir_info->virtual = 0;
        }
        mtree_entry_free(me);
        me = pmVar12;
      }
      else {
        me->parent = *(mtree_entry_conflict **)(pcVar13 + 0x10);
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar13 + 0x38) = me;
        *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &me->next;
      }
    }
    else {
      self = *(mtree_entry_conflict **)(pcVar13 + 8);
      uVar10 = get_path_component(local_138,(size_t)pcVar15,pcVar16);
      pcVar16 = pcVar15;
      local_148 = paVar1;
      if (uVar10 != 0) {
        pcVar14 = extraout_RDX_01;
        do {
          while( true ) {
            uVar18 = (ulong)uVar10;
            if ((int)uVar10 < 0) goto LAB_004b01b8;
            if (((uVar10 == 1) && (local_138[0] == '.')) && (self != (mtree_entry_conflict *)0x0))
            break;
            if (self == (mtree_entry_conflict *)0x0) {
              self = (mtree_entry_conflict *)0x0;
              goto LAB_004afec0;
            }
LAB_004afe0a:
            pmVar12 = (mtree_entry_conflict *)
                      __archive_rb_tree_find_node(&self->dir_info->rbtree,local_138);
            if (pmVar12 == (mtree_entry_conflict *)0x0) goto LAB_004afec0;
            if (*pcVar16 == '\0') goto LAB_004b01eb;
            if (pmVar12->dir_info == (dir_info *)0x0) {
              archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                                (pmVar12->pathname).s,(me->pathname).s);
              goto LAB_004b021c;
            }
            pcVar16 = pcVar16 + (pcVar16[uVar18] == '/') + uVar18;
            uVar10 = get_path_component(local_138,(size_t)pcVar16,fn);
            pcVar14 = extraout_RDX_03;
            self = pmVar12;
            if (uVar10 == 0) {
              uVar18 = 0;
              goto LAB_004afec0;
            }
          }
          if (self != *(mtree_entry_conflict **)(pcVar13 + 8)) goto LAB_004afe0a;
          if (pcVar16[1] == '/') {
            pcVar16 = pcVar16 + 2;
          }
          else {
            pcVar16 = pcVar16 + 1;
          }
          uVar10 = get_path_component(local_138,(size_t)pcVar16,pcVar14);
          pcVar14 = extraout_RDX_02;
        } while (uVar10 != 0);
      }
      uVar18 = 0;
LAB_004afec0:
      pmVar12 = self;
      local_150 = puVar17;
      if (*pcVar16 != '\0') {
LAB_004afed4:
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar15,(size_t)(pcVar16 + (uVar18 - (long)pcVar15)));
        pcVar14 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_004b00e3:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          archive_string_free(&local_168);
        }
        else {
          archive_entry_copy_pathname(entry_00,pcVar14);
          archive_entry_set_mode(entry_00,0x41ed);
          t = time((time_t *)0x0);
          archive_entry_set_mtime(entry_00,t,0);
          iVar9 = mtree_entry_new(a,entry_00,&local_140);
          archive_entry_free(entry_00);
          self = local_140;
          if (iVar9 < -0x14) goto LAB_004b00e3;
          local_140->dir_info->virtual = 1;
          archive_string_free(&local_168);
          pcVar14 = (self->pathname).s;
          if ((*pcVar14 == '.') && (pcVar14[1] == '\0')) {
            *(mtree_entry_conflict **)(pcVar13 + 8) = self;
            pmVar12 = self;
          }
          else {
            __archive_rb_tree_insert_node(&pmVar12->dir_info->rbtree,&self->rbnode);
          }
          self->parent = pmVar12;
          self->next = (mtree_entry_conflict *)0x0;
          **(undefined8 **)(pcVar13 + 0x38) = self;
          *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &self->next;
          pcVar16 = pcVar16 + (pcVar16[uVar18] == '/') + uVar18;
          uVar10 = get_path_component(local_138,(size_t)pcVar16,pcVar13);
          if (-1 < (int)uVar10) goto code_r0x004b000c;
          archive_string_free(&local_168);
LAB_004b01b8:
          archive_set_error(&a->archive,-1,"A name buffer is too small");
        }
        iVar8 = -0x1e;
        goto LAB_004b0221;
      }
LAB_004b003f:
      paVar1 = local_148;
      *(mtree_entry_conflict **)(pcVar13 + 0x10) = self;
      pcVar13[0x20] = '\0';
      pcVar13[0x21] = '\0';
      pcVar13[0x22] = '\0';
      pcVar13[0x23] = '\0';
      pcVar13[0x24] = '\0';
      pcVar13[0x25] = '\0';
      pcVar13[0x26] = '\0';
      pcVar13[0x27] = '\0';
      archive_string_ensure(local_148,(self->parentdir).length + (self->basename).length + 2);
      puVar17 = local_150;
      sVar2 = (self->parentdir).length;
      if ((self->basename).length + sVar2 == 0) {
        *paVar1->s = '\0';
      }
      else {
        if (sVar2 != 0) {
          pcVar13[0x20] = '\0';
          pcVar13[0x21] = '\0';
          pcVar13[0x22] = '\0';
          pcVar13[0x23] = '\0';
          pcVar13[0x24] = '\0';
          pcVar13[0x25] = '\0';
          pcVar13[0x26] = '\0';
          pcVar13[0x27] = '\0';
          archive_string_concat(paVar1,&self->parentdir);
          archive_strappend_char(paVar1,'/');
        }
        archive_string_concat(paVar1,&self->basename);
      }
      iVar9 = __archive_rb_tree_insert_node(&self->dir_info->rbtree,&me->rbnode);
      if (iVar9 == 0) {
        pmVar12 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node(&self->dir_info->rbtree,(me->basename).s);
        goto LAB_004b01eb;
      }
      me->parent = self;
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar13 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &me->next;
      me = local_170;
    }
LAB_004b034f:
    *puVar17 = me;
    if (me->reg_info != (reg_info *)0x0) {
      *(undefined4 *)(puVar17 + 0x1c) = 0;
      uVar10 = *(uint *)(puVar17 + 0x24);
      if ((uVar10 & 1) != 0) {
        puVar17[0x1c] = 1;
        puVar17[0x1d] = 0;
      }
      if ((uVar10 >> 8 & 1) != 0) {
        iVar9 = __archive_openssl_md5init((archive_md5_ctx *)(puVar17 + 0x1e));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe1) = *(byte *)((long)puVar17 + 0xe1) | 1;
          uVar10 = *(uint *)(puVar17 + 0x24);
        }
        else {
          uVar10 = *(uint *)(puVar17 + 0x24) & 0xfffffeff;
          *(uint *)(puVar17 + 0x24) = uVar10;
        }
      }
      if ((uVar10 >> 0xd & 1) != 0) {
        iVar9 = __archive_openssl_ripemd160init((archive_rmd160_ctx *)(puVar17 + 0x1f));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe1) = *(byte *)((long)puVar17 + 0xe1) | 0x20;
          uVar10 = *(uint *)(puVar17 + 0x24);
        }
        else {
          uVar10 = *(uint *)(puVar17 + 0x24) & 0xffffdfff;
          *(uint *)(puVar17 + 0x24) = uVar10;
        }
      }
      if ((uVar10 >> 0xe & 1) != 0) {
        iVar9 = __archive_openssl_sha1init((archive_sha1_ctx *)(puVar17 + 0x20));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe1) = *(byte *)((long)puVar17 + 0xe1) | 0x40;
          uVar10 = *(uint *)(puVar17 + 0x24);
        }
        else {
          uVar10 = *(uint *)(puVar17 + 0x24) & 0xffffbfff;
          *(uint *)(puVar17 + 0x24) = uVar10;
        }
      }
      if ((uVar10 >> 0x17 & 1) != 0) {
        iVar9 = __archive_openssl_sha256init((archive_sha256_ctx *)(puVar17 + 0x21));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe2) = *(byte *)((long)puVar17 + 0xe2) | 0x80;
          uVar10 = *(uint *)(puVar17 + 0x24);
        }
        else {
          uVar10 = *(uint *)(puVar17 + 0x24) & 0xff7fffff;
          *(uint *)(puVar17 + 0x24) = uVar10;
        }
      }
      if ((uVar10 >> 0x18 & 1) != 0) {
        iVar9 = __archive_openssl_sha384init((archive_sha384_ctx *)(puVar17 + 0x22));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe3) = *(byte *)((long)puVar17 + 0xe3) | 1;
          uVar10 = *(uint *)(puVar17 + 0x24);
        }
        else {
          uVar10 = *(uint *)(puVar17 + 0x24) & 0xfeffffff;
          *(uint *)(puVar17 + 0x24) = uVar10;
        }
      }
      if ((uVar10 >> 0x19 & 1) != 0) {
        iVar9 = __archive_openssl_sha512init((archive_sha512_ctx *)(puVar17 + 0x23));
        if (iVar9 == 0) {
          *(byte *)((long)puVar17 + 0xe3) = *(byte *)((long)puVar17 + 0xe3) | 2;
        }
        else {
          *(byte *)((long)puVar17 + 0x123) = *(byte *)((long)puVar17 + 0x123) & 0xfd;
        }
      }
    }
  }
  return iVar8;
code_r0x004b000c:
  uVar18 = (ulong)uVar10;
  pmVar12 = self;
  if (*pcVar16 == '\0') goto LAB_004b003f;
  goto LAB_004afed4;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}